

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

Table * sqlite3LocateTable(Parse *pParse,u32 flags,char *zName,char *zDbase)

{
  sqlite3 *db_00;
  int iVar1;
  char *pcVar2;
  char *zMsg;
  Module *pMod;
  sqlite3 *db;
  Table *p;
  char *zDbase_local;
  char *zName_local;
  u32 flags_local;
  Parse *pParse_local;
  
  db_00 = pParse->db;
  if (((db_00->mDbFlags & 0x10) == 0) && (iVar1 = sqlite3ReadSchema(pParse), iVar1 != 0)) {
    pParse_local = (Parse *)0x0;
  }
  else {
    db = (sqlite3 *)sqlite3FindTable(db_00,zName,zDbase);
    if (db == (sqlite3 *)0x0) {
      if (pParse->disableVtab == '\0') {
        zMsg = (char *)sqlite3HashFind(&db_00->aModule,zName);
        if ((zMsg == (char *)0x0) && (iVar1 = sqlite3_strnicmp(zName,"pragma_",7), iVar1 == 0)) {
          zMsg = (char *)sqlite3PragmaVtabRegister(db_00,zName);
        }
        if ((zMsg != (char *)0x0) &&
           (iVar1 = sqlite3VtabEponymousTableInit(pParse,(Module *)zMsg), iVar1 != 0)) {
          return *(Table **)(zMsg + 0x20);
        }
      }
      if ((flags & 2) != 0) {
        return (Table *)0x0;
      }
      pParse->checkSchema = '\x01';
    }
    else if ((db->errMask != 0) && (pParse->disableVtab != '\0')) {
      db = (sqlite3 *)0x0;
    }
    if (db == (sqlite3 *)0x0) {
      pcVar2 = "no such table";
      if ((flags & 1) != 0) {
        pcVar2 = "no such view";
      }
      if (zDbase == (char *)0x0) {
        sqlite3ErrorMsg(pParse,"%s: %s",pcVar2,zName);
      }
      else {
        sqlite3ErrorMsg(pParse,"%s: %s.%s",pcVar2,zDbase,zName);
      }
    }
    pParse_local = (Parse *)db;
  }
  return (Table *)pParse_local;
}

Assistant:

SQLITE_PRIVATE Table *sqlite3LocateTable(
  Parse *pParse,         /* context in which to report errors */
  u32 flags,             /* LOCATE_VIEW or LOCATE_NOERR */
  const char *zName,     /* Name of the table we are looking for */
  const char *zDbase     /* Name of the database.  Might be NULL */
){
  Table *p;
  sqlite3 *db = pParse->db;

  /* Read the database schema. If an error occurs, leave an error message
  ** and code in pParse and return NULL. */
  if( (db->mDbFlags & DBFLAG_SchemaKnownOk)==0 
   && SQLITE_OK!=sqlite3ReadSchema(pParse)
  ){
    return 0;
  }

  p = sqlite3FindTable(db, zName, zDbase);
  if( p==0 ){
#ifndef SQLITE_OMIT_VIRTUALTABLE
    /* If zName is the not the name of a table in the schema created using
    ** CREATE, then check to see if it is the name of an virtual table that
    ** can be an eponymous virtual table. */
    if( pParse->disableVtab==0 ){
      Module *pMod = (Module*)sqlite3HashFind(&db->aModule, zName);
      if( pMod==0 && sqlite3_strnicmp(zName, "pragma_", 7)==0 ){
        pMod = sqlite3PragmaVtabRegister(db, zName);
      }
      if( pMod && sqlite3VtabEponymousTableInit(pParse, pMod) ){
        return pMod->pEpoTab;
      }
    }
#endif
    if( flags & LOCATE_NOERR ) return 0;
    pParse->checkSchema = 1;
  }else if( IsVirtual(p) && pParse->disableVtab ){
    p = 0;
  }

  if( p==0 ){
    const char *zMsg = flags & LOCATE_VIEW ? "no such view" : "no such table";
    if( zDbase ){
      sqlite3ErrorMsg(pParse, "%s: %s.%s", zMsg, zDbase, zName);
    }else{
      sqlite3ErrorMsg(pParse, "%s: %s", zMsg, zName);
    }
  }

  return p;
}